

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O0

void __thiscall Network::compute_triangles(Network *this)

{
  uint uVar1;
  reference pvVar2;
  uint local_14;
  uint node_i;
  Network *this_local;
  
  this->total_triangles = 0;
  local_14 = 0;
  while( true ) {
    uVar1 = getN(this);
    if (uVar1 <= local_14) break;
    uVar1 = compute_triangles(this,local_14);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->triangle_count,(ulong)local_14);
    *pvVar2 = uVar1;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->triangle_count,(ulong)local_14);
    this->total_triangles = *pvVar2 + this->total_triangles;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void compute_triangles() {
        total_triangles = 0;
        for (unsigned int node_i = 0; node_i < getN(); node_i++) {
            triangle_count[node_i] = compute_triangles(node_i);
            total_triangles += triangle_count[node_i];
        }
    }